

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.cpp
# Opt level: O2

void __thiscall GNB::GNB(GNB *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_7c;
  allocator local_7b;
  allocator local_7a;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  string local_38 [32];
  
  this->_vptr_GNB = (_func_int **)&PTR__GNB_00108d90;
  std::__cxx11::string::string((string *)&local_78,"left",&local_79);
  std::__cxx11::string::string(local_58,"keep",&local_7a);
  std::__cxx11::string::string(local_38,"right",&local_7b);
  __l._M_len = 3;
  __l._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->possible_labels,__l,&local_7c);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_78._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

GNB::GNB()
{
  /**
   * TODO: Initialize GNB, if necessary. May depend on your implementation.
   */
}